

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

CheckedError __thiscall flatbuffers::Parser::ParseTypeFromProtoType(Parser *this,Type *type)

{
  int iVar1;
  undefined8 *in_RDX;
  type_lookup *ptVar2;
  bool bVar3;
  
  iVar1 = std::__cxx11::string::compare((char *)&type[1].struct_def);
  ptVar2 = ParseTypeFromProtoType::lookup;
  if (iVar1 == 0) {
    bVar3 = false;
  }
  else {
    do {
      bVar3 = ptVar2[1].proto_type == (char *)0x0;
      if (bVar3) goto LAB_0011c0f8;
      ptVar2 = ptVar2 + 1;
      iVar1 = std::__cxx11::string::compare((char *)&type[1].struct_def);
    } while (iVar1 != 0);
  }
  *in_RDX = *(undefined8 *)&ptVar2->fb_type;
  Next(this);
  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
  if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
    *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
  }
  if (bVar3) {
LAB_0011c0f8:
    if (*(int *)&type->field_0x1c == 0x2e) {
      Next(this);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0011c12f;
    }
    ParseTypeIdent(this,type);
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
      *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
    }
  }
LAB_0011c12f:
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseTypeFromProtoType(Type *type) {
  struct type_lookup {
    const char *proto_type;
    BaseType fb_type, element;
  };
  static type_lookup lookup[] = {
    { "float", BASE_TYPE_FLOAT, BASE_TYPE_NONE },
    { "double", BASE_TYPE_DOUBLE, BASE_TYPE_NONE },
    { "int32", BASE_TYPE_INT, BASE_TYPE_NONE },
    { "int64", BASE_TYPE_LONG, BASE_TYPE_NONE },
    { "uint32", BASE_TYPE_UINT, BASE_TYPE_NONE },
    { "uint64", BASE_TYPE_ULONG, BASE_TYPE_NONE },
    { "sint32", BASE_TYPE_INT, BASE_TYPE_NONE },
    { "sint64", BASE_TYPE_LONG, BASE_TYPE_NONE },
    { "fixed32", BASE_TYPE_UINT, BASE_TYPE_NONE },
    { "fixed64", BASE_TYPE_ULONG, BASE_TYPE_NONE },
    { "sfixed32", BASE_TYPE_INT, BASE_TYPE_NONE },
    { "sfixed64", BASE_TYPE_LONG, BASE_TYPE_NONE },
    { "bool", BASE_TYPE_BOOL, BASE_TYPE_NONE },
    { "string", BASE_TYPE_STRING, BASE_TYPE_NONE },
    { "bytes", BASE_TYPE_VECTOR, BASE_TYPE_UCHAR },
    { nullptr, BASE_TYPE_NONE, BASE_TYPE_NONE }
  };
  for (auto tl = lookup; tl->proto_type; tl++) {
    if (attribute_ == tl->proto_type) {
      type->base_type = tl->fb_type;
      type->element = tl->element;
      NEXT();
      return NoError();
    }
  }
  if (Is('.')) NEXT();  // qualified names may start with a . ?
  ECHECK(ParseTypeIdent(*type));
  return NoError();
}